

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffmkey(fitsfile *fptr,char *card,int *status)

{
  int iVar1;
  size_t bytepos;
  size_t sVar2;
  fitsfile *in_RDX;
  char *in_RSI;
  int *in_RDI;
  int keylength;
  size_t ii;
  size_t len;
  char tcard [81];
  undefined4 in_stack_ffffffffffffff70;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  fitsfile *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8;
  undefined1 uVar6;
  undefined7 in_stack_ffffffffffffffd9;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    ffmahd(in_RDX,in_stack_ffffffffffffffe4,
           (int *)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8),
           in_stack_ffffffffffffffd0);
  }
  strncpy(&stack0xffffffffffffff88,in_RSI,0x50);
  uVar6 = 0;
  bytepos = strlen(&stack0xffffffffffffff88);
  for (uVar4 = 0; uVar5 = bytepos, uVar4 < bytepos; uVar4 = uVar4 + 1) {
    if (((char)(&stack0xffffffffffffff88)[uVar4] < ' ') ||
       ('~' < (char)(&stack0xffffffffffffff88)[uVar4])) {
      (&stack0xffffffffffffff88)[uVar4] = 0x20;
    }
  }
  for (; uVar5 < 0x50; uVar5 = uVar5 + 1) {
    (&stack0xffffffffffffff88)[uVar5] = 0x20;
  }
  sVar2 = strcspn(&stack0xffffffffffffff88,"=");
  iVar3 = (int)sVar2;
  if (iVar3 == 0x50) {
    iVar3 = 8;
  }
  for (uVar4 = 0; uVar4 < (ulong)(long)iVar3; uVar4 = uVar4 + 1) {
    iVar1 = toupper((int)(char)(&stack0xffffffffffffff88)[uVar4]);
    (&stack0xffffffffffffff88)[uVar4] = (char)iVar1;
  }
  fftkey((char *)in_RDX,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  ffmbyt(in_stack_ffffffffffffff88,bytepos,(int)(uVar4 >> 0x20),
         (int *)CONCAT44(iVar3,in_stack_ffffffffffffff70));
  ffpbyt((fitsfile *)CONCAT71(in_stack_ffffffffffffffd9,uVar6),(LONGLONG)in_stack_ffffffffffffffd0,
         in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  return in_RDX->HDUposition;
}

Assistant:

int ffmkey(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *card,  /* I - card string value  */
           int *status)       /* IO - error status      */
/*
  replace the previously read card (i.e. starting 80 bytes before the
  (fptr->Fptr)->nextkey position) with the contents of the input card.
*/
{
    char tcard[81];
    size_t len, ii;
    int keylength = 8;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    strncpy(tcard,card,80);
    tcard[80] = '\0';

    len = strlen(tcard);

    /* silently replace any illegal characters with a space */
    for (ii=0; ii < len; ii++)  
        if (tcard[ii] < ' ' || tcard[ii] > 126) tcard[ii] = ' ';

    for (ii=len; ii < 80; ii++)    /* fill card with spaces if necessary */
        tcard[ii] = ' ';

    keylength = strcspn(tcard, "=");
    if (keylength == 80) keylength = 8;

    for (ii=0; ii < keylength; ii++)       /* make sure keyword name is uppercase */
        tcard[ii] = toupper(tcard[ii]);

    fftkey(tcard, status);        /* test keyword name contains legal chars */

/*  no need to do this any more, since any illegal characters have been removed
    fftrec(tcard, status);   */     /* test rest of keyword for legal chars   */

    /* move position of keyword to be over written */
    ffmbyt(fptr, ((fptr->Fptr)->nextkey) - 80, REPORT_EOF, status); 
    ffpbyt(fptr, 80, tcard, status);   /* write the 80 byte card */

    return(*status);
}